

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O1

void __thiscall
YAML::SingleDocParser::HandleFlowMap(SingleDocParser *this,EventHandler *eventHandler)

{
  deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *this_00;
  undefined4 *puVar1;
  bool bVar2;
  Token *pTVar3;
  Exception *pEVar4;
  Mark mark;
  Mark local_68;
  string local_58;
  Mark local_38;
  
  Scanner::pop(this->m_scanner);
  this_00 = (deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *)
            (this->m_pCollectionStack)._M_t.
            super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
            ._M_t.
            super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
            .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl;
  local_58._M_dataplus._M_p._0_4_ = 3;
  puVar1 = *(undefined4 **)(this_00 + 0x30);
  if (puVar1 == (undefined4 *)(*(long *)(this_00 + 0x40) + -4)) {
    std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>::
    _M_push_back_aux<YAML::CollectionType::value_const&>(this_00,(value *)&local_58);
  }
  else {
    *puVar1 = 3;
    *(undefined4 **)(this_00 + 0x30) = puVar1 + 1;
  }
  bVar2 = Scanner::empty(this->m_scanner);
  while( true ) {
    if (bVar2) {
      pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
      local_68 = Scanner::mark(this->m_scanner);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"end of map flow not found","");
      Exception::Exception(pEVar4,&local_68,&local_58);
      *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
      __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
    }
    pTVar3 = Scanner::peek(this->m_scanner);
    local_68 = pTVar3->mark;
    if (pTVar3->type == KEY) {
      Scanner::pop(this->m_scanner);
      HandleNode(this,eventHandler);
    }
    else {
      if (pTVar3->type == FLOW_MAP_END) {
        Scanner::pop(this->m_scanner);
        std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::
        pop_back((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *
                 )(this->m_pCollectionStack)._M_t.
                  super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
                  .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
        return;
      }
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,&local_68,0);
    }
    bVar2 = Scanner::empty(this->m_scanner);
    if ((bVar2) || (pTVar3 = Scanner::peek(this->m_scanner), pTVar3->type != VALUE)) {
      (*eventHandler->_vptr_EventHandler[4])(eventHandler,&local_68,0);
    }
    else {
      Scanner::pop(this->m_scanner);
      HandleNode(this,eventHandler);
    }
    bVar2 = Scanner::empty(this->m_scanner);
    if (bVar2) break;
    pTVar3 = Scanner::peek(this->m_scanner);
    if (pTVar3->type != FLOW_MAP_END) {
      if (pTVar3->type != FLOW_ENTRY) {
        pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"end of map flow not found","");
        Exception::Exception(pEVar4,&pTVar3->mark,&local_58);
        *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
        __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
      }
      Scanner::pop(this->m_scanner);
    }
    bVar2 = Scanner::empty(this->m_scanner);
  }
  pEVar4 = (Exception *)__cxa_allocate_exception(0x40);
  local_38 = Scanner::mark(this->m_scanner);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"end of map flow not found","");
  Exception::Exception(pEVar4,&local_38,&local_58);
  *(undefined ***)pEVar4 = &PTR__BadFile_008899d0;
  __cxa_throw(pEVar4,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

void SingleDocParser::HandleFlowMap(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::FlowMap);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP_FLOW);

    Token& token = m_scanner.peek();
    const Mark mark = token.mark;
    // first check for end
    if (token.type == Token::FLOW_MAP_END) {
      m_scanner.pop();
      break;
    }

    // grab key (if non-null)
    if (token.type == Token::KEY) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(mark, NullAnchor);
    }

    // now grab value (optional)
    if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(mark, NullAnchor);
    }

    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP_FLOW);

    // now eat the separator (or could be a map end, which we ignore - but if
    // it's neither, then it's a bad node)
    Token& nextToken = m_scanner.peek();
    if (nextToken.type == Token::FLOW_ENTRY)
      m_scanner.pop();
    else if (nextToken.type != Token::FLOW_MAP_END)
      throw ParserException(nextToken.mark, ErrorMsg::END_OF_MAP_FLOW);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::FlowMap);
}